

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_ColorAlpha_16_to_16(SBlitJob *job)

{
  uint color;
  u16 c1;
  u16 uVar1;
  u32 uVar2;
  u32 dx;
  ulong uVar3;
  uint uVar4;
  void *pvVar5;
  
  color = job->argb;
  uVar4 = (color >> 0x18) - ((int)color >> 0x1f);
  if (7 < uVar4) {
    pvVar5 = job->dst;
    c1 = video::A8R8G8B8toA1R5G5B5(color);
    for (uVar2 = 0; uVar2 != job->height; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; (u32)uVar3 != job->width; uVar3 = (ulong)((u32)uVar3 + 1)) {
        uVar1 = PixelBlend16(*(u16 *)((long)pvVar5 + uVar3 * 2),c1,(u16)(uVar4 >> 3));
        *(u16 *)((long)pvVar5 + uVar3 * 2) = uVar1;
      }
      pvVar5 = (void *)((long)pvVar5 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_ColorAlpha_16_to_16(const SBlitJob *job)
{
	u16 *dst = (u16 *)job->dst;

	const u16 alpha = extractAlpha(job->argb) >> 3;
	if (0 == alpha)
		return;
	const u32 src = video::A8R8G8B8toA1R5G5B5(job->argb);

	for (u32 dy = 0; dy != job->height; ++dy) {
		for (u32 dx = 0; dx != job->width; ++dx) {
			dst[dx] = PixelBlend16(dst[dx], src, alpha);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}